

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

_Bool array_container_negation_range
                (array_container_t *src,int range_start,int range_end,container_t **dst)

{
  int32_t lenarray;
  uint16_t *array;
  int iVar1;
  uint uVar2;
  int32_t iVar3;
  uint uVar4;
  bitset_container_t *pbVar5;
  array_container_t *paVar6;
  ulong uVar7;
  int size;
  
  if (range_end - range_start == 0 || range_end < range_start) {
    paVar6 = array_container_clone(src);
    *dst = paVar6;
  }
  else {
    array = src->array;
    lenarray = src->cardinality;
    uVar2 = binarySearch(array,lenarray,(uint16_t)range_start);
    uVar2 = (int)uVar2 >> 0x1f ^ uVar2;
    iVar3 = binarySearch(array,lenarray,(short)range_end - 1);
    iVar1 = -2 - iVar3;
    if (-1 < iVar3) {
      iVar1 = iVar3;
    }
    size = (range_end - range_start) + lenarray + (uVar2 - iVar1) * 2 + -2;
    if (0x1000 < size) {
      pbVar5 = bitset_container_from_array(src);
      bitset_flip_range(pbVar5->words,range_start,range_end);
      pbVar5->cardinality = size;
      *dst = pbVar5;
      return true;
    }
    paVar6 = array_container_create_given_capacity(size);
    *dst = paVar6;
    if (size != 0) {
      memcpy(paVar6->array,src->array,(ulong)uVar2 * 2);
      uVar4 = uVar2;
      while ((uVar7 = (ulong)uVar2, range_start < range_end && ((int)uVar4 <= iVar1))) {
        if ((uint16_t)range_start == src->array[uVar4]) {
          uVar4 = uVar4 + 1;
        }
        else {
          uVar2 = uVar2 + 1;
          paVar6->array[uVar7] = (uint16_t)range_start;
        }
        range_start = range_start + 1;
      }
      for (; range_start < range_end; range_start = range_start + 1) {
        paVar6->array[uVar7] = (uint16_t)range_start;
        uVar7 = uVar7 + 1;
      }
      memcpy(paVar6->array + (uVar7 & 0xffffffff),src->array + ((long)iVar1 + 1U & 0xffffffff),
             ((long)src->cardinality - ((long)iVar1 + 1U)) * 2);
    }
    paVar6->cardinality = size;
  }
  return false;
}

Assistant:

bool array_container_negation_range(
    const array_container_t *src,
    const int range_start, const int range_end,
    container_t **dst
){
    /* close port of the Java implementation */
    if (range_start >= range_end) {
        *dst = array_container_clone(src);
        return false;
    }

    int32_t start_index =
        binarySearch(src->array, src->cardinality, (uint16_t)range_start);
    if (start_index < 0) start_index = -start_index - 1;

    int32_t last_index =
        binarySearch(src->array, src->cardinality, (uint16_t)(range_end - 1));
    if (last_index < 0) last_index = -last_index - 2;

    const int32_t current_values_in_range = last_index - start_index + 1;
    const int32_t span_to_be_flipped = range_end - range_start;
    const int32_t new_values_in_range =
        span_to_be_flipped - current_values_in_range;
    const int32_t cardinality_change =
        new_values_in_range - current_values_in_range;
    const int32_t new_cardinality = src->cardinality + cardinality_change;

    if (new_cardinality > DEFAULT_MAX_SIZE) {
        bitset_container_t *temp = bitset_container_from_array(src);
        bitset_flip_range(temp->words, (uint32_t)range_start,
                          (uint32_t)range_end);
        temp->cardinality = new_cardinality;
        *dst = temp;
        return true;
    }

    array_container_t *arr =
        array_container_create_given_capacity(new_cardinality);
    *dst = (container_t *)arr;
    if(new_cardinality == 0) {
      arr->cardinality = new_cardinality;
      return false; // we are done.
    }
    // copy stuff before the active area
    memcpy(arr->array, src->array, start_index * sizeof(uint16_t));

    // work on the range
    int32_t out_pos = start_index, in_pos = start_index;
    int32_t val_in_range = range_start;
    for (; val_in_range < range_end && in_pos <= last_index; ++val_in_range) {
        if ((uint16_t)val_in_range != src->array[in_pos]) {
            arr->array[out_pos++] = (uint16_t)val_in_range;
        } else {
            ++in_pos;
        }
    }
    for (; val_in_range < range_end; ++val_in_range)
        arr->array[out_pos++] = (uint16_t)val_in_range;

    // content after the active range
    memcpy(arr->array + out_pos, src->array + (last_index + 1),
           (src->cardinality - (last_index + 1)) * sizeof(uint16_t));
    arr->cardinality = new_cardinality;
    return false;
}